

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O0

void __thiscall
Nova::Example<float,_3>::Write_Substep(Example<float,_3> *this,string *title,int substep,int level)

{
  ostream *poVar1;
  void *this_00;
  int level_local;
  int substep_local;
  string *title_local;
  Example<float,_3> *this_local;
  
  if (level <= this->write_substeps_level) {
    std::__cxx11::string::operator=((string *)&this->frame_title,(string *)title);
    poVar1 = std::operator<<(this->output,"Writing substep [");
    poVar1 = std::operator<<(poVar1,(string *)&this->frame_title);
    poVar1 = std::operator<<(poVar1,"]: output_number=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->output_number + 1);
    poVar1 = std::operator<<(poVar1,", frame=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->current_frame);
    poVar1 = std::operator<<(poVar1,", substep=");
    this_00 = (void *)std::ostream::operator<<(poVar1,substep);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->output_number = this->output_number + 1;
    (*this->_vptr_Example[3])();
    std::__cxx11::string::operator=((string *)&this->frame_title,"");
  }
  return;
}

Assistant:

void Example<T,d>::
Write_Substep(const std::string& title,const int substep,const int level)
{
    if(level<=write_substeps_level)
    {
        frame_title=title;
        *output<<"Writing substep ["<<frame_title<<"]: output_number="<<output_number+1<<", frame="<<current_frame<<", substep="<<substep<<std::endl;
        Write_Output_Files(++output_number);frame_title="";
    }
}